

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testorder.cpp
# Opt level: O3

int main(void)

{
  printf("Your system represents 2^16 as:   %x:%x:%x:%x\n",0,0,1,0);
  printf("Network Order represents 2^16 as: %x:%x:%x:%x\n",0,0,1,0);
  printf("\nYou are using %s Endian.\n","Big");
  return 0x100;
}

Assistant:

int
main(void)
{
  int big;
  long h, n;
  char *hp, *np;
  h = 65536;
  n = htonl(h);
  hp = (char *)&h;
  np = (char *)&n;
  printf("Your system represents 2^16 as:   %x:%x:%x:%x\n", hp[0], hp[1], hp[2],
         hp[3]);
  printf("Network Order represents 2^16 as: %x:%x:%x:%x\n", hp[0], hp[1], hp[2],
         hp[3]);
  big = (h = n);
  printf("\nYou are using %s Endian.\n", (big ? "Big" : "Little"));
  return big;
}